

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O3

void ghash_add_cipher(ghash_ctx *ctx,uint8_t *buf,size_t n)

{
  size_t sVar1;
  
  if (ctx->state != 2) {
    if (ctx->state != 1) {
      abort();
    }
    sVar1 = ctx->buffer_used;
    if (sVar1 != 0) {
      memset(ctx->buffer + sVar1,0,0x10 - sVar1);
      ghash_block(ctx,ctx->buffer);
      ctx->buffer_used = 0;
    }
    ctx->state = 2;
  }
  ctx->len_cipher = ctx->len_cipher + n;
  cf_blockwise_accumulate(ctx->buffer,&ctx->buffer_used,0x10,buf,n,ghash_block,ctx);
  return;
}

Assistant:

static void ghash_add_cipher(ghash_ctx *ctx, const uint8_t *buf, size_t n)
{
  if (ctx->state == STATE_AAD)
  {
    ghash_add_pad(ctx);
    ctx->state = STATE_CIPHER;
  }
  
  assert(ctx->state == STATE_CIPHER);
  ctx->len_cipher += n;
  ghash_add(ctx, buf, n);
}